

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_test.cc
# Opt level: O0

void __thiscall (anonymous_namespace)::QMTest::PreEncodeFrameHook(QMTest *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  QMTest *in_stack_00000020;
  
  anon_unknown.dwarf_51cb0c::QMTest::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_ENABLE_QM, 1);
      encoder->Control(AV1E_SET_QM_MIN, qm_min_);
      encoder->Control(AV1E_SET_QM_MAX, qm_max_);

      encoder->Control(AOME_SET_MAX_INTRA_BITRATE_PCT, 100);
      if (mode_ == ::libaom_test::kRealTime) {
        encoder->Control(AV1E_SET_ALLOW_WARPED_MOTION, 0);
        encoder->Control(AV1E_SET_ENABLE_GLOBAL_MOTION, 0);
        encoder->Control(AV1E_SET_ENABLE_OBMC, 0);
      }
    }
  }